

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O2

MatExpr * __thiscall imgviz::labelToBgr(imgviz *this,Mat *label,Mat *bgr,double alpha)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int in_R8D;
  size_t i;
  ulong uVar5;
  Vec<unsigned_char,_3> local_24f;
  undefined1 local_24c;
  Vec<unsigned_char,_3> local_24b;
  imgviz *local_248;
  double local_240;
  long local_238;
  Vec<unsigned_char,_3> local_22b;
  ulong local_228;
  Mat *local_220;
  double local_218;
  undefined8 local_210;
  Vec3b label_color;
  Mat bgr_;
  long local_1e0;
  long *local_1a8;
  Vec3b bgr_color;
  
  local_248 = this;
  local_240 = alpha;
  cv::Mat::clone();
  if ((*(ushort *)bgr & 0xfff) == 0) {
    _bgr_color = 0x1010000;
    _label_color = 0x2010000;
    cv::cvtColor((cv *)&bgr_color,(_InputArray *)&label_color,(_OutputArray *)0x8,0,in_R8D);
  }
  if ((*(uint *)label & 0xfff) == 4) {
    if ((_bgr_ & 0xfff) == 0x10) {
      local_210 = CONCAT44((int)**(undefined8 **)(label + 0x40),
                           (int)((ulong)**(undefined8 **)(label + 0x40) >> 0x20));
      cv::Mat::zeros(&bgr_color,&local_210,0x10);
      cv::MatExpr::operator_cast_to_Mat((MatExpr *)local_248);
      cv::MatExpr::~MatExpr((MatExpr *)&bgr_color);
      local_218 = 1.0 - local_240;
      uVar4 = 0;
      local_220 = label;
      while (uVar4 < (ulong)(long)*(int *)(label + 8)) {
        local_238 = (long)(int)uVar4;
        lVar3 = 0;
        local_228 = uVar4;
        for (uVar5 = 0; lVar2 = local_238, uVar5 < (ulong)(long)*(int *)(label + 0xc);
            uVar5 = uVar5 + 1) {
          lVar1 = (lVar3 >> 0x20) * 3;
          cv::Matx<unsigned_char,_3,_1>::Matx
                    ((Matx<unsigned_char,_3,_1> *)&bgr_color,
                     (uchar *)(*local_1a8 * local_238 + local_1e0 + lVar1));
          getLabelColor((imgviz *)&label_color,
                        *(uint8_t *)
                         ((lVar3 >> 0x1e) +
                         **(long **)(label + 0x48) * lVar2 + *(long *)(label + 0x10)));
          cv::operator*(local_240,&local_24b);
          cv::operator*(local_218,&local_22b);
          cv::Vec<unsigned_char,_3>::Vec(&local_24f,&local_24b,&local_22b,&local_24c);
          lVar2 = **(long **)(local_248 + 0x48) * local_238 + *(long *)(local_248 + 0x10);
          *(uchar *)(lVar2 + 2 + lVar1) = local_24f.super_Matx<unsigned_char,_3,_1>.val[2];
          *(undefined2 *)(lVar2 + lVar1) = local_24f.super_Matx<unsigned_char,_3,_1>.val._0_2_;
          lVar3 = lVar3 + 0x100000000;
          label = local_220;
        }
        uVar4 = local_228 + 1;
      }
      cv::Mat::~Mat(&bgr_);
      return (MatExpr *)local_248;
    }
    __assert_fail("bgr_.type() == CV_8UC3",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                  ,0x101,"cv::Mat imgviz::labelToBgr(const cv::Mat, const cv::Mat, const double)");
  }
  __assert_fail("label.type() == CV_32SC1",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                ,0x100,"cv::Mat imgviz::labelToBgr(const cv::Mat, const cv::Mat, const double)");
}

Assistant:

cv::Mat labelToBgr(const cv::Mat label, const cv::Mat bgr,
                   const double alpha = 0.5) {
  cv::Mat bgr_ = bgr.clone();
  if (bgr.type() == CV_8UC1) {
    cv::cvtColor(bgr, bgr_, cv::COLOR_GRAY2BGR);
  }

  assert(label.type() == CV_32SC1);
  assert(bgr_.type() == CV_8UC3);

  cv::Mat label_bgr = cv::Mat::zeros(label.size(), CV_8UC3);

  for (size_t j = 0; j < label.rows; j++) {
    for (size_t i = 0; i < label.cols; i++) {
      cv::Vec3b bgr_color = bgr_.at<cv::Vec3b>(j, i);
      cv::Vec3b label_color = getLabelColor(label.at<int32_t>(j, i) % 256);
      label_bgr.at<cv::Vec3b>(j, i) =
          alpha * label_color + (1 - alpha) * bgr_color;
    }
  }
  return label_bgr;
}